

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::DataParameter::DataParameter(DataParameter *this,DataParameter *from)

{
  void *pvVar1;
  bool bVar2;
  undefined2 uVar3;
  int iVar4;
  float fVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint32 uVar9;
  bool bVar10;
  bool bVar11;
  undefined2 uVar12;
  uint uVar13;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DataParameter_00760570;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar13 = (from->_has_bits_).has_bits_[0];
  if ((uVar13 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->source_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->source_).ptr_);
    uVar13 = (from->_has_bits_).has_bits_[0];
  }
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar13 & 2) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->mean_file_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->mean_file_).ptr_);
  }
  uVar7 = from->batch_size_;
  uVar8 = from->crop_size_;
  uVar9 = from->rand_skip_;
  bVar10 = from->mirror_;
  bVar11 = from->force_encoded_color_;
  uVar12 = *(undefined2 *)&from->field_0x36;
  bVar2 = from->force_encoded_color_;
  uVar3 = *(undefined2 *)&from->field_0x36;
  iVar4 = from->backend_;
  fVar5 = from->scale_;
  uVar6 = from->prefetch_;
  this->mirror_ = from->mirror_;
  this->force_encoded_color_ = bVar2;
  *(undefined2 *)&this->field_0x36 = uVar3;
  this->backend_ = iVar4;
  this->scale_ = fVar5;
  this->prefetch_ = uVar6;
  this->batch_size_ = uVar7;
  this->crop_size_ = uVar8;
  this->rand_skip_ = uVar9;
  this->mirror_ = bVar10;
  this->force_encoded_color_ = bVar11;
  *(undefined2 *)&this->field_0x36 = uVar12;
  return;
}

Assistant:

DataParameter::DataParameter(const DataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_mean_file()) {
    mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
  }
  ::memcpy(&batch_size_, &from.batch_size_,
    reinterpret_cast<char*>(&prefetch_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(prefetch_));
  // @@protoc_insertion_point(copy_constructor:caffe.DataParameter)
}